

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O2

void anon_unknown.dwarf_2ca381::writeReadYa
               (Box2i *dw,int tileSizeX,int tileSizeY,char *fileName,
               _func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *fillPixels)

{
  ulong sizeY;
  ulong sizeX;
  float *pfVar1;
  float fVar2;
  long lVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  half *phVar9;
  undefined4 in_register_00000014;
  long lVar10;
  undefined4 in_register_00000034;
  char *__filename;
  half *phVar11;
  long lVar12;
  Array2D<Imf_3_4::Rgba> pixels1;
  Array2D<Imf_3_4::Rgba> pixels2;
  int local_78;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  __filename = (char *)CONCAT44(in_register_00000034,tileSizeX);
  lVar8 = (long)(dw->max).x - (long)(dw->min).x;
  sizeY = lVar8 + 1;
  lVar10 = (long)(dw->max).y - (long)(dw->min).y;
  sizeX = lVar10 + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&pixels1,sizeX,sizeY);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&pixels2,sizeX,sizeY);
  (*(code *)CONCAT44(in_register_00000014,tileSizeY))
            (&pixels1,sizeY & 0xffffffff,sizeX & 0xffffffff);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  local_38 = 0;
  uVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,__filename,0x13,0x1b,0,0,dw,dw,0x18,
             &local_38,0,3,uVar4);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
            ((Rgba *)&out,
             (ulong)(pixels1._data + (-(long)(dw->min).y * pixels1._sizeY - (long)(dw->min).x)),1);
  iVar5 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)&out);
  iVar6 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)&out);
  Imf_3_4::TiledRgbaOutputFile::writeTiles((int)&out,0,iVar5 + -1,0,iVar6 + -1);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,__filename,iVar5);
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer
            ((Rgba *)&out,
             (ulong)(pixels2._data + (-(long)(dw->min).y * pixels2._sizeY - (long)(dw->min).x)),1);
  iVar5 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&out);
  iVar6 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&out);
  Imf_3_4::TiledRgbaInputFile::readTiles((int)&out,0,iVar5 + -1,0,iVar6 + -1);
  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
  poVar7 = std::operator<<((ostream *)&std::cout,"comparing");
  std::endl<char,std::char_traits<char>>(poVar7);
  local_78 = (int)lVar8;
  phVar11 = &(pixels2._data)->a;
  phVar9 = &(pixels1._data)->a;
  lVar8 = 0;
  do {
    if ((int)lVar10 < lVar8) {
      remove(__filename);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&pixels2);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&pixels1);
      return;
    }
    lVar12 = 0;
    while (lVar12 <= local_78) {
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4 + -3]._h * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar12 * 4 + -3]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.r == p2.r",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x86,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4 + -2]._h * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar12 * 4 + -2]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.g == p2.g",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x87,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4 + -1]._h * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar12 * 4 + -1]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.b == p2.b",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x88,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar12 * 4]._h * 4);
      lVar3 = lVar12 * 4;
      lVar12 = lVar12 + 1;
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar11[lVar3]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p1.a == p2.a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledYa.cpp"
                      ,0x89,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
    }
    lVar8 = lVar8 + 1;
    phVar11 = phVar11 + pixels2._sizeY * 4;
    phVar9 = phVar9 + pixels1._sizeY * 4;
  } while( true );
}

Assistant:

void
writeReadYa (
    Box2i&     dw,
    int        tileSizeX,
    int        tileSizeY,
    const char fileName[],
    void (*fillPixels) (Array2D<Rgba>& pixels, int w, int h))
{
    int           w = dw.max.x - dw.min.x + 1;
    int           h = dw.max.y - dw.min.y + 1;
    Array2D<Rgba> pixels1 (h, w);
    Array2D<Rgba> pixels2 (h, w);

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
        TiledRgbaOutputFile out (
            fileName,
            tileSizeX,
            tileSizeY,
            ONE_LEVEL,
            ROUND_DOWN,
            dw,
            dw,
            WRITE_YA);

        out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    cout << "reading " << flush;

    {
        TiledRgbaInputFile in (fileName);

        in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            const Rgba& p1 = pixels1[y][x];
            const Rgba& p2 = pixels2[y][x];

            assert (p1.r == p2.r);
            assert (p1.g == p2.g);
            assert (p1.b == p2.b);
            assert (p1.a == p2.a);
        }
    }

    remove (fileName);
}